

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O2

void __thiscall
Gudhi::Toplex_map::insert_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range)

{
  pointer puVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *__ht;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range_01;
  __node_base *p_Var5;
  pointer __k;
  Simplex *facet;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range_02;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_78;
  Gudhi local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar3 = membership<std::vector<unsigned_long,std::allocator<unsigned_long>>>(this,vertex_range);
  if (bVar3) {
    return;
  }
  facets<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              *)&local_78,(Gudhi *)vertex_range,vertex_range_00);
  sVar2 = local_78._M_bucket_count;
  vertex_range_02 =
       (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
       local_78._M_buckets;
  do {
    if (vertex_range_02 ==
        (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)sVar2) {
      std::
      vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 *)&local_78);
      facets<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)&local_78,(Gudhi *)vertex_range,vertex_range_01);
      for (; local_78._M_buckets != (__buckets_ptr)local_78._M_bucket_count;
          local_78._M_buckets = (__buckets_ptr)((long)local_78._M_buckets + 0x30)) {
        get_key<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                  (local_40,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)local_78._M_buckets);
        erase_maximal(this,(Simplex_ptr *)local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      }
      std::
      vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 *)&local_78);
      goto LAB_00104fe3;
    }
    bVar3 = maximality<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                      (this,vertex_range_02);
    vertex_range_02 = vertex_range_02 + 1;
  } while (bVar3);
  std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             *)&local_78);
  puVar1 = (vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (__k = (vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
    sVar4 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,__k);
    if (sVar4 != 0) {
      __ht = &std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this,__k)->_M_h;
      std::
      _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable(&local_78,__ht);
      p_Var5 = &local_78._M_before_begin;
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        bVar3 = included<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                          ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)p_Var5[1]._M_nxt,vertex_range);
        if (bVar3) {
          erase_maximal(this,(Simplex_ptr *)(p_Var5 + 1));
        }
      }
      std::
      _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_78);
    }
  }
LAB_00104fe3:
  insert_independent_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (this,vertex_range);
  return;
}

Assistant:

void Toplex_map::insert_simplex(const Input_vertex_range& vertex_range) {
  if (membership(vertex_range)) return;
  bool replace_facets = true;
  for (const Toplex_map::Simplex& facet : facets(vertex_range))
    if (!maximality(facet)) {
      replace_facets = false;
      break;
    }
  if (replace_facets)
    for (const Toplex_map::Simplex& facet : facets(vertex_range)) erase_maximal(get_key(facet));
  else
    for (const Vertex& v : vertex_range)
      if (t0.count(v))
        for (const Toplex_map::Simplex_ptr& fptr : Simplex_ptr_set(t0.at(v)))
          // Copy constructor needed because the set is modified
          if (included(*fptr, vertex_range)) erase_maximal(fptr);
  // We erase all the maximal faces of the simplex
  insert_independent_simplex(vertex_range);
}